

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::ruby::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  FileDescriptor FVar1;
  int iVar2;
  undefined4 extraout_var;
  Printer printer;
  Printer local_c8;
  ZeroCopyOutputStream *output;
  
  FVar1 = file[0x3a];
  if (((byte)FVar1 & 0xfe) == 2) {
    GetOutputFilename((string *)&local_c8,*(string **)file);
    iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&local_c8);
    output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
    if (local_c8._0_8_ != (long)&local_c8 + 0x10U) {
      operator_delete((void *)local_c8._0_8_);
    }
    io::Printer::Printer(&local_c8,output,'$');
    GenerateFile(file,&local_c8,error);
    io::Printer::~Printer(&local_c8);
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  else {
    std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x3f7b78);
  }
  return ((byte)FVar1 & 0xfe) == 2;
}

Assistant:

bool Generator::Generate(
    const FileDescriptor* file,
    const std::string& parameter,
    GeneratorContext* generator_context,
    std::string* error) const {

  if (file->syntax() != FileDescriptor::SYNTAX_PROTO3 &&
      file->syntax() != FileDescriptor::SYNTAX_PROTO2) {
    *error = "Invalid or unsupported proto syntax";
    return false;
  }

  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(GetOutputFilename(file->name())));
  io::Printer printer(output.get(), '$');

  return GenerateFile(file, &printer, error);
}